

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational_tests.cc
# Opt level: O3

void __thiscall RationalTest_SimpleSubtract_Test::TestBody(RationalTest_SimpleSubtract_Test *this)

{
  char *message;
  rational_comparison_t comparison;
  rational_t result;
  rational_t expected;
  rational_t r2;
  rational_t r1;
  AssertHelper local_b0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  internal local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  rational_comparison_t local_90;
  rational_t local_80;
  rational_t local_68;
  rational_t local_50;
  rational_t local_38;
  
  rational_init(&local_38,2,3);
  rational_init(&local_50,-1,6);
  rational_init(&local_68,5,6);
  rational_subtract(&local_38,&local_50,&local_80);
  local_a8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       rational_compare(&local_80,&local_68,&local_90);
  local_b0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            (local_a0,"rational_compare(&result, &expected, &comparison)","0",(long *)&local_a8,
             (int *)&local_b0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/rational_adt/rational_tests.cc"
               ,0x70,message);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._M_head_impl + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  return;
}

Assistant:

TEST(RationalTest, SimpleSubtract)
{
    rational_t r1, r2, expected, result;
    rational_comparison_t comparison;

    rational_init(&r1, 2, 3);
    rational_init(&r2, -1, 6);
    rational_init(&expected, 5, 6);

    rational_subtract(&r1, &r2, &result);

    ASSERT_EQ(rational_compare(&result, &expected, &comparison), 0);
}